

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall cmCTestMultiProcessHandler::StartNextTests(cmCTestMultiProcessHandler *this)

{
  uv_timer_ptr *puVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  unsigned_long uVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  uv_timer_s *puVar8;
  ulong uVar9;
  mapped_type *ppcVar10;
  ostream *poVar11;
  uint64_t timeout;
  key_type *pkVar12;
  undefined8 unaff_RBP;
  PropertiesMap *this_00;
  pointer piVar13;
  int *test;
  double dVar14;
  SystemInformation info;
  TestList copy;
  string testWithMinProcessors;
  ostringstream cmCTestLog_msg;
  long *local_258;
  long local_250;
  long local_248 [2];
  ulong local_238;
  ulong local_230;
  uint local_224;
  ulong local_220;
  ulong local_218;
  SystemInformation local_210;
  key_type local_204;
  uv_timer_ptr *local_200;
  ulong local_1f8;
  vector<int,_std::allocator<int>_> local_1f0;
  char *local_1d8;
  long local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  PropertiesMap *local_1b8;
  key_type *local_1b0;
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  puVar1 = &this->TestLoadRetryTimer;
  puVar8 = ::cm::uv_handle_ptr_base_<uv_timer_s>::get((uv_handle_ptr_base_<uv_timer_s> *)puVar1);
  if (puVar8 != (uv_timer_s *)0x0) {
    puVar8 = ::cm::uv_handle_ptr_::operator_cast_to_uv_timer_s_
                       (&puVar1->super_uv_handle_ptr_<uv_timer_s>);
    uv_timer_stop(puVar8);
  }
  if ((this->Tests).
      super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    bVar5 = CheckStopTimePassed(this);
    if ((!bVar5) &&
       ((bVar5 = cmCTest::GetStopOnFailure(this->CTest), !bVar5 ||
        ((this->Failed->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start ==
         (this->Failed->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish)))) {
      local_218 = this->ParallelLevel;
      bVar5 = this->RunningCount <= local_218;
      uVar9 = local_218 - this->RunningCount;
      local_238 = 0;
      if (bVar5) {
        local_238 = uVar9;
      }
      if ((bVar5 && uVar9 != 0) && (this->SerialTestRunning == false)) {
        local_1d8 = &local_1c8;
        local_1d0 = 0;
        local_1c8 = '\0';
        cmsys::SystemInformation::SystemInformation(&local_210);
        if (this->TestLoad == 0) {
          local_220 = 0;
          local_1f8 = 0;
          uVar7 = 0;
        }
        else {
          local_220 = this->FakeLoadForTesting;
          if (local_220 == 0) {
            dVar14 = cmsys::SystemInformation::GetLoadAverage(&local_210);
            dVar14 = ceil(dVar14);
            local_220 = (long)(dVar14 - 9.223372036854776e+18) & (long)dVar14 >> 0x3f | (long)dVar14
            ;
          }
          else {
            this->FakeLoadForTesting = 1;
          }
          local_1f8 = 0;
          if (local_220 <= this->TestLoad) {
            local_1f8 = this->TestLoad - local_220;
          }
          if (local_1f8 <= local_238) {
            local_238 = local_1f8;
          }
          uVar7 = (uint)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
        }
        local_200 = puVar1;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_1f0,&(this->SortedTests).super_vector<int,_std::allocator<int>_>);
        local_224 = uVar7;
        if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          this_00 = &this->Properties;
          local_1b0 = local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          pkVar12 = local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          piVar13 = local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_1b8 = this_00;
          do {
            cVar6 = '\x02';
            if ((this->SerialTestRunning == false) &&
               ((ppcVar10 = std::
                            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                            ::operator[](&this_00->
                                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                         ,piVar13), (*ppcVar10)->RunSerial != true ||
                (cVar6 = '\x03', this->RunningCount == 0)))) {
              local_1a8._0_4_ = *piVar13;
              ppcVar10 = std::
                         map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ::operator[](&this_00->
                                       super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                      ,(key_type *)local_1a8);
              local_230 = (long)(*ppcVar10)->Processors;
              if (this->ParallelLevel < (ulong)(long)(*ppcVar10)->Processors) {
                local_230 = this->ParallelLevel;
              }
              if (((this->HaveAffinity != 0) && (this->HaveAffinity < local_230)) &&
                 (ppcVar10 = std::
                             map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ::operator[](&this_00->
                                           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                          ,(key_type *)local_1a8),
                 (*ppcVar10)->WantAffinity != false)) {
                local_230 = this->HaveAffinity;
              }
              if (this->TestLoad == 0) {
                bVar5 = false;
              }
              else {
                bVar5 = true;
                if (local_230 <= local_1f8) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"OK to run ",10);
                  local_204 = *piVar13;
                  ppcVar10 = std::
                             map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ::operator[](&this_00->
                                           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                          ,&local_204);
                  local_258 = local_248;
                  pcVar2 = ((*ppcVar10)->Name)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_258,pcVar2,
                             pcVar2 + ((*ppcVar10)->Name)._M_string_length);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,(char *)local_258,local_250);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,", it requires ",0xe);
                  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11," procs & system load is: ",0x19);
                  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                  std::ostream::put((char)poVar11);
                  std::ostream::flush();
                  if (local_258 != local_248) {
                    operator_delete(local_258,local_248[0] + 1);
                  }
                  pcVar3 = this->CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar3,0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                               ,0x232,(char *)local_258,false);
                  if (local_258 != local_248) {
                    operator_delete(local_258,local_248[0] + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base(local_138);
                  local_224 = 0;
                  bVar5 = false;
                  this_00 = local_1b8;
                }
              }
              if (local_230 <= local_218) {
                local_258 = (long *)CONCAT44(local_258._4_4_,*piVar13);
                ppcVar10 = std::
                           map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ::operator[](&this_00->
                                         super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                        ,(key_type *)&local_258);
                pcVar2 = ((*ppcVar10)->Name)._M_dataplus._M_p;
                local_1a8._0_8_ = local_198;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1a8,pcVar2,pcVar2 + ((*ppcVar10)->Name)._M_string_length)
                ;
                std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_1a8);
                if ((_func_int **)local_1a8._0_8_ != local_198) {
                  operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
                }
                local_218 = local_230;
                pkVar12 = local_1b0;
              }
              uVar9 = local_238 - local_230;
              if ((bVar5 || local_238 < local_230) || (bVar5 = StartTest(this,*piVar13), !bVar5)) {
                cVar6 = (local_238 == 0) * '\x02';
              }
              else {
                cVar6 = '\0';
                local_238 = uVar9;
              }
            }
          } while (((cVar6 == '\x03') || (cVar6 == '\0')) &&
                  (piVar13 = piVar13 + 1, piVar13 != pkVar12));
        }
        if ((local_224 & 1) != 0) {
          if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            bVar5 = true;
          }
          else {
            bVar5 = true;
            piVar13 = local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              ppcVar10 = std::
                         map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ::operator[](&(this->Properties).
                                       super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                      ,piVar13);
              if ((*ppcVar10)->RunSerial == false) {
                bVar5 = false;
              }
              piVar13 = piVar13 + 1;
            } while (piVar13 !=
                     local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          }
          puVar1 = local_200;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"***** WAITING, ",0xf);
          pcVar3 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                       ,0x24e,(char *)local_258,false);
          if (local_258 != local_248) {
            operator_delete(local_258,local_248[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          if (this->SerialTestRunning == true) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Waiting for RUN_SERIAL test to finish.",0x26);
            pcVar3 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x252,(char *)local_258,false);
          }
          else if (bVar5) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Only RUN_SERIAL tests remain, awaiting available slot."
                       ,0x36);
            pcVar3 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x255,(char *)local_258,false);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"System Load: ",0xd);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,", Max Allowed Load: ",0x14);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,", Smallest test ",0x10);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_1d8,local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," requires ",10);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            pcVar3 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x25c,(char *)local_258,false);
          }
          if (local_258 != local_248) {
            operator_delete(local_258,local_248[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"*****",5);
          std::ios::widen((char)(ostream *)local_1a8 +
                          (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
          std::ostream::put((char)local_1a8);
          std::ostream::flush();
          pcVar3 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                       ,0x25f,(char *)local_258,false);
          if (local_258 != local_248) {
            operator_delete(local_258,local_248[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar7 = cmSystemTools::RandomSeed();
          uVar4 = this->FakeLoadForTesting;
          puVar8 = ::cm::uv_handle_ptr_base_<uv_timer_s>::get
                             ((uv_handle_ptr_base_<uv_timer_s> *)puVar1);
          if (puVar8 == (uv_timer_s *)0x0) {
            ::cm::uv_timer_ptr::init(puVar1,(EVP_PKEY_CTX *)&this->Loop);
          }
          timeout = 10;
          if (uVar4 == 0) {
            timeout = (ulong)((uVar7 % 5) * 1000 + 1000);
          }
          ::cm::uv_timer_ptr::start(puVar1,OnTestLoadRetryCB,timeout,0);
        }
        if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (key_type *)0x0) {
          operator_delete(local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        cmsys::SystemInformation::~SystemInformation(&local_210);
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
        }
      }
    }
    return;
  }
  ::cm::uv_handle_ptr_base_<uv_timer_s>::reset((uv_handle_ptr_base_<uv_timer_s> *)puVar1);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartNextTests()
{
  if (this->TestLoadRetryTimer.get() != nullptr) {
    // This timer may be waiting to call StartNextTests again.
    // Since we have been called it is no longer needed.
    uv_timer_stop(this->TestLoadRetryTimer);
  }

  if (this->Tests.empty()) {
    this->TestLoadRetryTimer.reset();
    return;
  }

  if (this->CheckStopTimePassed()) {
    return;
  }

  if (this->CheckStopOnFailure() && !this->Failed->empty()) {
    return;
  }

  size_t numToStart = 0;

  if (this->RunningCount < this->ParallelLevel) {
    numToStart = this->ParallelLevel - this->RunningCount;
  }

  if (numToStart == 0) {
    return;
  }

  // Don't start any new tests if one with the RUN_SERIAL property
  // is already running.
  if (this->SerialTestRunning) {
    return;
  }

  bool allTestsFailedTestLoadCheck = false;
  size_t minProcessorsRequired = this->ParallelLevel;
  std::string testWithMinProcessors;

  cmsys::SystemInformation info;

  unsigned long systemLoad = 0;
  size_t spareLoad = 0;
  if (this->TestLoad > 0) {
    // Activate possible wait.
    allTestsFailedTestLoadCheck = true;

    // Check for a fake load average value used in testing.
    if (this->FakeLoadForTesting > 0) {
      systemLoad = this->FakeLoadForTesting;
      // Drop the fake load for the next iteration to a value low enough
      // that the next iteration will start tests.
      this->FakeLoadForTesting = 1;
    }
    // If it's not set, look up the true load average.
    else {
      systemLoad = static_cast<unsigned long>(ceil(info.GetLoadAverage()));
    }
    spareLoad =
      (this->TestLoad > systemLoad ? this->TestLoad - systemLoad : 0);

    // Don't start more tests than the spare load can support.
    if (numToStart > spareLoad) {
      numToStart = spareLoad;
    }
  }

  TestList copy = this->SortedTests;
  for (auto const& test : copy) {
    // Take a nap if we're currently performing a RUN_SERIAL test.
    if (this->SerialTestRunning) {
      break;
    }
    // We can only start a RUN_SERIAL test if no other tests are also
    // running.
    if (this->Properties[test]->RunSerial && this->RunningCount > 0) {
      continue;
    }

    size_t processors = this->GetProcessorsUsed(test);
    bool testLoadOk = true;
    if (this->TestLoad > 0) {
      if (processors <= spareLoad) {
        cmCTestLog(this->CTest, DEBUG,
                   "OK to run " << this->GetName(test) << ", it requires "
                                << processors << " procs & system load is: "
                                << systemLoad << std::endl);
        allTestsFailedTestLoadCheck = false;
      } else {
        testLoadOk = false;
      }
    }

    if (processors <= minProcessorsRequired) {
      minProcessorsRequired = processors;
      testWithMinProcessors = this->GetName(test);
    }

    if (testLoadOk && processors <= numToStart && this->StartTest(test)) {
      numToStart -= processors;
    } else if (numToStart == 0) {
      break;
    }
  }

  if (allTestsFailedTestLoadCheck) {
    // Find out whether there are any non RUN_SERIAL tests left, so that the
    // correct warning may be displayed.
    bool onlyRunSerialTestsLeft = true;
    for (auto const& test : copy) {
      if (!this->Properties[test]->RunSerial) {
        onlyRunSerialTestsLeft = false;
      }
    }
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "***** WAITING, ");

    if (this->SerialTestRunning) {
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "Waiting for RUN_SERIAL test to finish.");
    } else if (onlyRunSerialTestsLeft) {
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "Only RUN_SERIAL tests remain, awaiting available slot.");
    } else {
      /* clang-format off */
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "System Load: " << systemLoad << ", "
                 "Max Allowed Load: " << this->TestLoad << ", "
                 "Smallest test " << testWithMinProcessors <<
                 " requires " << minProcessorsRequired);
      /* clang-format on */
    }
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "*****" << std::endl);

    // Wait between 1 and 5 seconds before trying again.
    unsigned int milliseconds = (cmSystemTools::RandomSeed() % 5 + 1) * 1000;
    if (this->FakeLoadForTesting) {
      milliseconds = 10;
    }
    if (this->TestLoadRetryTimer.get() == nullptr) {
      this->TestLoadRetryTimer.init(this->Loop, this);
    }
    this->TestLoadRetryTimer.start(
      &cmCTestMultiProcessHandler::OnTestLoadRetryCB, milliseconds, 0);
  }
}